

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::writeDataToTexture
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  pointer *__x;
  uint target_00;
  Functions *pFVar1;
  _Alloc_hider _Var2;
  pointer pixels;
  int iVar3;
  GLenum GVar4;
  ostream *poVar5;
  size_t sVar6;
  TestError *this_01;
  deUint32 dVar7;
  undefined4 in_register_0000000c;
  int iVar8;
  size_type __new_size;
  SparseTexture2CommitmentTestCase *this_02;
  long lVar9;
  GLint depth;
  uint local_3d4;
  TransferFormat local_3d0;
  GLint height;
  GLint width;
  SparseTexture2CommitmentTestCase *local_3c0;
  undefined8 local_3b8;
  GLint local_3ac;
  ostream *local_3a8;
  Functions *local_3a0;
  string shader;
  string local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  string local_330;
  ShaderProgram program;
  ProgramSources local_240;
  TokenStrings s;
  
  local_3b8 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTextureCommitmentTestCase).field_0x88;
  local_3a0 = gl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Fill Texture [level: ",0x15);
  local_3a8 = (ostream *)this_00;
  poVar5 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] - ",4);
  if ((this->super_SparseTextureCommitmentTestCase).mState.levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x3e4);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_3d0 = glu::getTransferFormat((this->super_SparseTextureCommitmentTestCase).mState.format);
  local_3d4 = target;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTextureCommitmentTestCase).mState,level,&width,&height,
             &depth);
  target_00 = local_3d4;
  if ((0 < height && 0 < width) &&
     ((this->super_SparseTextureCommitmentTestCase).mState.minDepth <= depth)) {
    if (local_3d4 == 0x8513) {
      depth = depth * 6;
    }
    iVar8 = height * width * depth;
    local_3c0 = this;
    iVar3 = tcu::TextureFormat::getPixelSize
                      (&(this->super_SparseTextureCommitmentTestCase).mState.format);
    vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __new_size = (size_type)(iVar3 * iVar8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecData,__new_size);
    pixels = vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    pFVar1 = local_3a0;
    if ((target_00 & 0xfffffffd) == 0x9100) {
      if (0 < (local_3c0->super_SparseTextureCommitmentTestCase).mState.samples) {
        local_3d0 = (TransferFormat)((ulong)local_3d0 & 0xffffffff00000000);
        local_3ac = level;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&shader,st2_compute_textureFill,(allocator<char> *)&s);
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"image","");
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          this_02 = (SparseTexture2CommitmentTestCase *)0x1be54c4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"image","");
          createShaderTokens(&s,this_02,local_3d4,(GLint)local_3b8,local_3d0.format,&local_330,
                             &local_378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
          __x = &program.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
          replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
          replaceToken("<RESULT_EXPECTED>",s.resultExpected._M_dataplus._M_p,&shader);
          replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_240._193_8_ = 0;
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          memset(&local_240,0,0xac);
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__x,shader._M_dataplus._M_p,
                     shader._M_dataplus._M_p + shader._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_240.sources +
                      (uint)program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,(value_type *)__x);
          pFVar1 = local_3a0;
          if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
              program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
            operator_delete(program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (long)program.m_shaders[1].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
          }
          glu::ShaderProgram::ShaderProgram
                    (&program,((local_3c0->super_SparseTextureCommitmentTestCase).super_TestCase.
                              m_context)->m_renderCtx,&local_240);
          if (program.m_program.m_info.linkOk == true) {
            (*pFVar1->useProgram)(program.m_program.m_program);
            GVar4 = (*pFVar1->getError)();
            glu::checkError(GVar4,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x419);
            (*pFVar1->bindImageTexture)(0,*texture,local_3ac,'\0',0,0x88b9,(GLenum)local_3b8);
            GVar4 = (*pFVar1->getError)();
            glu::checkError(GVar4,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x41c);
            (*pFVar1->uniform1i)(1,0);
            GVar4 = (*pFVar1->getError)();
            glu::checkError(GVar4,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x41e);
            (*pFVar1->dispatchCompute)(width,height,depth);
            GVar4 = (*pFVar1->getError)();
            glu::checkError(GVar4,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x420);
            (*pFVar1->memoryBarrier)(0xffffffff);
            GVar4 = (*pFVar1->getError)();
            glu::checkError(GVar4,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x422);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3a8,"Compute shader compilation failed (writing) for target: ",0x38);
            poVar5 = (ostream *)std::ostream::operator<<(local_3a8,local_3d4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", sample: ",10);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3d0.format);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", infoLog: ",0xb);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,((*program.m_shaders[5].
                                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                       infoLog._M_dataplus._M_p,
                                ((*program.m_shaders[5].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                _M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", shaderSource: ",0x10);
            _Var2 = shader._M_dataplus;
            if (shader._M_dataplus._M_p == (pointer)0x0) {
              std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
            }
            else {
              sVar6 = strlen(shader._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var2._M_p,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_240.transformFeedbackVaryings);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&local_240.attribLocationBindings);
          lVar9 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&local_240.sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar9));
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != -0x18);
          TokenStrings::~TokenStrings(&s);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shader._M_dataplus._M_p != &shader.field_2) {
            operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
          }
          dVar7 = local_3d0.format + 1;
          local_3d0.format = dVar7;
        } while ((int)dVar7 < (local_3c0->super_SparseTextureCommitmentTestCase).mState.samples);
      }
    }
    else {
      gl4cts::Texture::SubImage
                (local_3a0,target_00,level,0,0,0,width,height,depth,local_3d0.format,
                 local_3d0.dataType,pixels);
      GVar4 = (*pFVar1->getError)();
      glu::checkError(GVar4,"SubImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x3fe);
    }
    if (vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return true;
}

Assistant:

bool SparseTexture2CommitmentTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
														  GLuint& texture, GLint level)
{
	mLog << "Fill Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		if (target != GL_TEXTURE_2D_MULTISAMPLE && target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			Texture::SubImage(gl, target, level, 0, 0, 0, width, height, depth, transferFormat.format,
							  transferFormat.dataType, (GLvoid*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "SubImage");
		}
		// For multisample texture use compute shader to store image data
		else
		{
			for (GLint sample = 0; sample < mState.samples; ++sample)
			{
				std::string shader = st2_compute_textureFill;

				// Adjust shader source to texture format
				TokenStrings s = createShaderTokens(target, format, sample);

				replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
				replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
				replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
				replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
				replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
				replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

				ProgramSources sources;
				sources << ComputeSource(shader);

				// Build and run shader
				ShaderProgram program(m_context.getRenderContext(), sources);
				if (program.isOk())
				{
					gl.useProgram(program.getProgram());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
					gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
										GL_WRITE_ONLY, format);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
					gl.uniform1i(1, 0 /* image_unit */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
					gl.dispatchCompute(width, height, depth);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
					gl.memoryBarrier(GL_ALL_BARRIER_BITS);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
				}
				else
				{
					mLog << "Compute shader compilation failed (writing) for target: " << target
						 << ", format: " << format << ", sample: " << sample
						 << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
						 << ", shaderSource: " << shader.c_str() << " - ";
				}
			}
		}
	}

	return true;
}